

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

int OCTET_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                      void *app_key)

{
  int iVar1;
  byte *pbVar2;
  code *in_RCX;
  int in_EDX;
  char *pcVar3;
  long *in_RSI;
  undefined8 in_R8;
  int tmp_i;
  size_t i;
  uint8_t *end;
  uint8_t *buf;
  char *p;
  char scratch [52];
  OCTET_STRING_t *st;
  char *h2c;
  int local_9c;
  ulong local_98;
  byte *local_88;
  char *local_80;
  char local_78 [56];
  long *local_40;
  char *local_38;
  undefined8 local_30;
  code *local_28;
  int local_1c;
  int local_4;
  
  local_38 = "0123456789ABCDEF";
  local_80 = local_78;
  if ((in_RSI == (long *)0x0) || ((*in_RSI == 0 && ((int)in_RSI[1] != 0)))) {
    iVar1 = (*in_RCX)("<absent>",8,in_R8);
    local_4 = 0;
    if (iVar1 < 0) {
      local_4 = -1;
    }
  }
  else {
    local_88 = (byte *)*in_RSI;
    pbVar2 = local_88 + (int)in_RSI[1];
    local_98 = 0;
    local_40 = in_RSI;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    for (; local_88 < pbVar2; local_88 = local_88 + 1) {
      if (((local_98 & 0xf) == 0) && ((local_98 != 0 || (0x10 < (int)local_40[1])))) {
        iVar1 = (*local_28)(local_78,(long)local_80 - (long)local_78,local_30);
        if (iVar1 < 0) {
          return -1;
        }
        iVar1 = (*local_28)("\n",1,local_30);
        if (iVar1 < 0) {
          return -1;
        }
        for (local_9c = 0; local_9c < local_1c; local_9c = local_9c + 1) {
          iVar1 = (*local_28)(" ",1,local_30);
          if (iVar1 < 0) {
            return -1;
          }
        }
        local_80 = local_78;
      }
      *local_80 = "0123456789ABCDEF"[(int)(uint)*local_88 >> 4];
      pcVar3 = local_80 + 2;
      local_80[1] = "0123456789ABCDEF"[(int)(*local_88 & 0xf)];
      local_80 = local_80 + 3;
      *pcVar3 = ' ';
      local_98 = local_98 + 1;
    }
    if ((local_78 < local_80) &&
       (iVar1 = (*local_28)(local_78,local_80 + (-1 - (long)local_78),local_30), iVar1 < 0)) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
OCTET_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	(void)td;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	for(i = 0; buf < end; buf++, i++) {
		if(!(i % 16) && (i || st->size > 16)) {
			if(cb(scratch, p - scratch, app_key) < 0)
				return -1;
			_i_INDENT(1);
			p = scratch;
		}
		*p++ = h2c[(*buf >> 4) & 0x0F];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Remove the tail space */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}